

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt__buf stbtt__cff_get_index(stbtt__buf *b)

{
  int o;
  byte bVar1;
  stbtt_uint32 sVar2;
  uint n;
  stbtt__buf sVar3;
  int offsize;
  int start;
  int count;
  stbtt__buf *b_local;
  
  o = b->cursor;
  sVar2 = stbtt__buf_get(b,2);
  if (sVar2 != 0) {
    bVar1 = stbtt__buf_get8(b);
    n = (uint)bVar1;
    if (n == 0 || 4 < n) {
      __assert_fail("offsize >= 1 && offsize <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                    ,0x49c,"stbtt__buf stbtt__cff_get_index(stbtt__buf *)");
    }
    stbtt__buf_skip(b,n * sVar2);
    sVar2 = stbtt__buf_get(b,n);
    stbtt__buf_skip(b,sVar2 - 1);
  }
  sVar3 = stbtt__buf_range(b,o,b->cursor - o);
  return sVar3;
}

Assistant:

static stbtt__buf stbtt__cff_get_index(stbtt__buf *b)
{
   int count, start, offsize;
   start = b->cursor;
   count = stbtt__buf_get16(b);
   if (count) {
      offsize = stbtt__buf_get8(b);
      STBTT_assert(offsize >= 1 && offsize <= 4);
      stbtt__buf_skip(b, offsize * count);
      stbtt__buf_skip(b, stbtt__buf_get(b, offsize) - 1);
   }
   return stbtt__buf_range(b, start, b->cursor - start);
}